

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ising_model.cc
# Opt level: O3

void output(vector<double,_std::allocator<double>_> *Ea,vector<double,_std::allocator<double>_> *ca,
           int simulations,double E_exact,double c_exact)

{
  long lVar1;
  pointer pdVar2;
  pointer pdVar3;
  ostream *poVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  double dVar8;
  vector<double,_std::allocator<double>_> *pvVar9;
  char local_5b [11];
  vector<double,_std::allocator<double>_> *local_50;
  double local_48;
  double local_40;
  long local_38;
  
  lVar6 = (long)simulations;
  pdVar2 = (Ea->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data
           ._M_start;
  pdVar2[lVar6] = 0.0;
  pdVar3 = (ca->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data
           ._M_start;
  pdVar3[lVar6] = 0.0;
  lVar1 = lVar6 + 1;
  pdVar2[lVar6 + 1] = 0.0;
  pdVar3[lVar6 + 1] = 0.0;
  dVar8 = (double)simulations;
  uVar7 = (ulong)(uint)simulations;
  if (0 < simulations) {
    uVar5 = 0;
    do {
      pdVar2[lVar6] = pdVar2[uVar5] / dVar8 + pdVar2[lVar6];
      pdVar3[lVar6] = pdVar3[uVar5] / dVar8 + pdVar3[lVar6];
      uVar5 = uVar5 + 1;
    } while (uVar7 != uVar5);
    if (0 < simulations) {
      uVar5 = 0;
      do {
        pdVar2[lVar1] =
             (pdVar2[uVar5] - pdVar2[lVar6]) * (pdVar2[uVar5] - pdVar2[lVar6]) + pdVar2[lVar1];
        pdVar3[lVar1] =
             (pdVar3[uVar5] - pdVar3[lVar6]) * (pdVar3[uVar5] - pdVar3[lVar6]) + pdVar3[lVar1];
        uVar5 = uVar5 + 1;
      } while (uVar7 != uVar5);
    }
  }
  pvVar9 = (vector<double,_std::allocator<double>_> *)((dVar8 + -1.0) * dVar8);
  dVar8 = pdVar2[lVar1] / (double)pvVar9;
  pdVar2[lVar1] = dVar8;
  local_48 = E_exact;
  local_40 = c_exact;
  if (dVar8 < 0.0) {
    local_50 = pvVar9;
    dVar8 = sqrt(dVar8);
    pvVar9 = local_50;
  }
  else {
    dVar8 = SQRT(dVar8);
  }
  (Ea->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data._M_start
  [lVar1] = dVar8;
  pdVar2 = (ca->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data
           ._M_start;
  dVar8 = pdVar2[lVar1] / (double)pvVar9;
  pdVar2[lVar1] = dVar8;
  if (dVar8 < 0.0) {
    dVar8 = sqrt(dVar8);
  }
  else {
    dVar8 = SQRT(dVar8);
  }
  (ca->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data._M_start
  [lVar1] = dVar8;
  local_38 = lVar1;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n\t E\t\t c\n",9);
  local_50 = ca;
  if (0 < simulations) {
    uVar5 = 0;
    do {
      local_5b[0] = '\t';
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_5b,1);
      *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 8) = 8;
      poVar4 = std::ostream::_M_insert<double>
                         ((Ea->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                          super__Vector_impl_data._M_start[uVar5]);
      local_5b[1] = 9;
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_5b + 1,1);
      *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 8) = 8;
      poVar4 = std::ostream::_M_insert<double>
                         ((local_50->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                          super__Vector_impl_data._M_start[uVar5]);
      local_5b[2] = 10;
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_5b + 2,1);
      uVar5 = uVar5 + 1;
    } while (uVar7 != uVar5);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\t--------------\t--------------",0x1e);
  local_5b[3] = 10;
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_5b + 3,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"mean\t",5);
  *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 8) = 8;
  poVar4 = std::ostream::_M_insert<double>
                     ((Ea->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                      super__Vector_impl_data._M_start[lVar6]);
  local_5b[4] = 9;
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_5b + 4,1);
  pvVar9 = local_50;
  *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 8) = 8;
  poVar4 = std::ostream::_M_insert<double>
                     ((local_50->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                      super__Vector_impl_data._M_start[lVar6]);
  local_5b[5] = 10;
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_5b + 5,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"Del\t",4);
  *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 8) = 8;
  poVar4 = std::ostream::_M_insert<double>
                     ((Ea->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                      super__Vector_impl_data._M_start[lVar6] - local_48);
  local_5b[6] = 9;
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_5b + 6,1);
  *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 8) = 8;
  poVar4 = std::ostream::_M_insert<double>
                     ((pvVar9->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                      super__Vector_impl_data._M_start[lVar6] - local_40);
  local_5b[7] = 10;
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_5b + 7,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"sig\t",4);
  lVar1 = local_38;
  *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 8) = 8;
  poVar4 = std::ostream::_M_insert<double>
                     ((Ea->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                      super__Vector_impl_data._M_start[local_38]);
  local_5b[8] = 9;
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_5b + 8,1);
  *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 8) = 8;
  poVar4 = std::ostream::_M_insert<double>
                     ((pvVar9->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                      super__Vector_impl_data._M_start[lVar1]);
  local_5b[9] = 10;
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_5b + 9,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"Del/sig\t",8);
  *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 8) = 8;
  pdVar2 = (Ea->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data
           ._M_start;
  poVar4 = std::ostream::_M_insert<double>(ABS(pdVar2[lVar6] - local_48) / pdVar2[lVar1]);
  local_5b[10] = 9;
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_5b + 10,1);
  *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 8) = 8;
  pdVar2 = (pvVar9->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  poVar4 = std::ostream::_M_insert<double>(ABS(pdVar2[lVar6] - local_40) / pdVar2[lVar1]);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  return;
}

Assistant:

void output(std::vector<double> &Ea, std::vector<double> &ca, int simulations, double E_exact,
            double c_exact) {
  Ea[simulations] = 0.0;
  ca[simulations] = 0.0;
  Ea[simulations + 1] = 0.0;
  ca[simulations + 1] = 0.0;
  for (int j{0}; j < simulations; ++j) {
    Ea[simulations] += Ea[j] / simulations;
    ca[simulations] += ca[j] / simulations;
  }
  for (int j{0}; j < simulations; ++j) {
    Ea[simulations + 1] += (Ea[j] - Ea[simulations]) * (Ea[j] - Ea[simulations]);
    ca[simulations + 1] += (ca[j] - ca[simulations]) * (ca[j] - ca[simulations]);
  }
  Ea[simulations + 1] /= (simulations - 1.0) * simulations;
  Ea[simulations + 1] = std::sqrt(Ea[simulations + 1]);
  // Student_t(0.99, simulations-1l);
  ca[simulations + 1] /= (simulations - 1.0) * simulations;
  ca[simulations + 1] = std::sqrt(ca[simulations + 1]);
  // Student_t(0.99, simulations-1l);
  std::cout << "\n\t E\t\t c\n";
  for (int j{0}; j < simulations; ++j)
    std::cout << '\t' << std::setprecision(8) << Ea[j] << '\t' << std::setprecision(8) << ca[j]
              << '\n';
  std::cout << "\t--------------\t--------------" << '\n'
            << "mean\t" << std::setprecision(8) << Ea[simulations] << '\t'
            << std::setprecision(8) << ca[simulations] << '\n'
            << "Del\t" << std::setprecision(8) << Ea[simulations] - E_exact << '\t'
            << std::setprecision(8) << ca[simulations] - c_exact << '\n'
            << "sig\t" << std::setprecision(8) << Ea[simulations + 1] << '\t'
            << std::setprecision(8) << ca[simulations + 1] << '\n'
            << "Del/sig\t" << std::setprecision(8)
            << std::abs(Ea[simulations] - E_exact) / Ea[simulations + 1] << '\t'
            << std::setprecision(8) << std::abs(ca[simulations] - c_exact) / ca[simulations + 1]
            << std::endl;
}